

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O0

pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
* __thiscall
LayerConv::convolution
          (pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
           *__return_storage_ptr__,LayerConv *this,ImageVolume *input)

{
  Index *this_00;
  size_t sVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  size_type sVar5;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pPVar6;
  Index IVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 local_e8 [8];
  ImageVolume output_a;
  ImageVolume output_z;
  non_const_type local_b0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_a8;
  undefined1 local_98 [8];
  MatrixXd conv_mat;
  undefined1 local_70 [8];
  MatrixXd filters_mat;
  MatrixXd input_mat;
  LayerSize output_size;
  size_type channels;
  ImageVolume *input_local;
  LayerConv *this_local;
  
  sVar2 = std::
          vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
          ::size(input);
  if (sVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"convolution");
    poVar3 = std::operator<<(poVar3,":: fatal error: ");
    poVar3 = std::operator<<(poVar3,"empty input is not allowed!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    pair<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>
    ::
    pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_true>
              (__return_storage_ptr__);
  }
  else {
    pvVar4 = std::
             vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
             ::operator[](input,0);
    sVar2 = std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::size(pvVar4);
    sVar5 = std::
            vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
            ::size(&this->__filters);
    if (sVar5 == 0) {
      init_filters(this,sVar2);
    }
    this_00 = &input_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
    Dimension::Dimension((Dimension *)this_00);
    pvVar4 = std::
             vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
             ::operator[](input,0);
    pPVar6 = &std::
              vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[](pvVar4,0)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
    IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar6);
    dVar8 = (double)(this->super_LayerBase)._padding;
    sVar1 = this->__filter_size;
    auVar9._8_4_ = (int)(sVar1 >> 0x20);
    auVar9._0_8_ = sVar1;
    auVar9._12_4_ = 0x45300000;
    dVar8 = floor(((dVar8 + dVar8 + (double)IVar7) -
                  ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) /
                  (double)(this->super_LayerBase)._stride + 1.0);
    input_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)dVar8;
    pvVar4 = std::
             vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
             ::operator[](input,0);
    pPVar6 = &std::
              vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[](pvVar4,0)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
    IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar6);
    dVar8 = (double)(this->super_LayerBase)._padding;
    sVar1 = this->__filter_size;
    auVar10._8_4_ = (int)(sVar1 >> 0x20);
    auVar10._0_8_ = sVar1;
    auVar10._12_4_ = 0x45300000;
    floor(((dVar8 + dVar8 + (double)IVar7) -
          ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) /
          (double)(this->super_LayerBase)._stride + 1.0);
    img2mat((MatrixXd *)
            &filters_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols,this,input,(LayerSize *)this_00,this->__filter_size,
            (this->super_LayerBase)._padding,(this->super_LayerBase)._stride);
    filters2mat((MatrixXd *)local_70,this,&this->__filters,false);
    local_a8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                          &filters_mat.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,
                          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_70);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_98,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_a8);
    local_b0 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->__baises);
    output_z.
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_98);
    Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator+=
              ((VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)
               &output_z.
                super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_b0);
    mat2img((ImageVolume *)
            &output_a.
             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,this,(MatrixXd *)local_98,
            (LayerSize *)
            &input_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols);
    apply_activation((ImageVolume *)local_e8,this,
                     (ImageVolume *)
                     &output_a.
                      super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    make_pair<std::vector<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,std::allocator<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>>&,std::vector<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,std::allocator<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>>&>
              (__return_storage_ptr__,
               (vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)&output_a.
                   super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)local_e8);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               *)local_e8);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               *)&output_a.
                  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_98)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_70)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &filters_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols);
  }
  return __return_storage_ptr__;
}

Assistant:

pair< ImageVolume, ImageVolume > LayerConv::convolution(const ImageVolume& input) {
	if (input.size() <= 0) {
		cout << __FUNCTION__ << ":: fatal error: " << "empty input is not allowed!" << endl;
		return pair< ImageVolume, ImageVolume >();
	}
	auto channels = input[0].size(); // filter channels number

	if (__filters.size() <= 0) init_filters(channels);

	LayerSize output_size;
	output_size.channels = __num_filters;
	output_size.rows = static_cast<Index>(floor((input[0][0].rows() + 2.0 * _padding - __filter_size) / (1.0 * _stride) + 1));
	output_size.cols = static_cast<Index>(floor((input[0][0].cols() + 2.0 * _padding - __filter_size) / (1.0 * _stride) + 1));

	auto input_mat = img2mat(input, output_size, __filter_size, _padding, _stride);
	auto filters_mat = filters2mat(__filters);

	MatrixXd conv_mat = input_mat * filters_mat;
	conv_mat.rowwise() += __baises.transpose();
	auto output_z = mat2img(conv_mat, output_size);
	auto output_a = apply_activation(output_z);

	return make_pair(output_z, output_a);
}